

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QTimerInfo_*>::clear(QList<QTimerInfo_*> *this)

{
  Data *pDVar1;
  QArrayData *data;
  QTimerInfo **ppQVar2;
  qsizetype capacity;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size == 0) goto LAB_003cede9;
  pDVar1 = (this->d).d;
  if (pDVar1 == (Data *)0x0) {
LAB_003ced85:
    capacity = 0;
  }
  else {
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      (this->d).size = 0;
      goto LAB_003cede9;
    }
    if (pDVar1 == (Data *)0x0) goto LAB_003ced85;
    capacity = (pDVar1->super_QArrayData).alloc;
  }
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppQVar2 = (QTimerInfo **)QArrayData::allocate(&local_20,8,0x10,capacity,KeepSize);
  data = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_20;
  (this->d).ptr = ppQVar2;
  (this->d).size = 0;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,8,0x10);
    }
  }
LAB_003cede9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }